

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O1

void set_bounce(parse_t *ps,char *timespec)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *fmt;
  UT_string *s;
  int interval;
  int local_1c;
  
  sVar3 = strlen(timespec);
  iVar2 = (int)sVar3 + -1;
  bVar1 = timespec[iVar2];
  timespec[iVar2] = '\0';
  iVar2 = __isoc99_sscanf(timespec,"%u",&local_1c);
  if (iVar2 == 1) {
    if (bVar1 < 0x6d) {
      if (bVar1 == 100) {
        local_1c = local_1c * 0x15180;
      }
      else {
        if (bVar1 != 0x68) {
LAB_0010472a:
          s = ps->em;
          fmt = "invalid time unit in \'bounce every\'";
          goto LAB_00104709;
        }
        local_1c = local_1c * 0xe10;
      }
    }
    else if (bVar1 != 0x73) {
      if (bVar1 != 0x6d) goto LAB_0010472a;
      local_1c = local_1c * 0x3c;
    }
    ps->job->bounce_interval = local_1c;
  }
  else {
    s = ps->em;
    fmt = "invalid time interval in \'bounce every\'";
LAB_00104709:
    utstring_printf(s,fmt);
    ps->rc = -1;
  }
  return;
}

Assistant:

void set_bounce(parse_t *ps, char *timespec) { 
  int l = strlen(timespec), interval;
  char *unit_ptr = &timespec[l-1];
  char unit = *unit_ptr;
  *unit_ptr = '\0';
  if (sscanf(timespec, "%u", &interval) != 1) {
    utstring_printf(ps->em, "invalid time interval in 'bounce every'");
    ps->rc = -1;
    return;
  }

  switch (unit) {
    case 's': break;
    case 'm': interval *= 60;       break;
    case 'h': interval *= 60*60;    break;
    case 'd': interval *= 60*60*24; break;
    default: 
      utstring_printf(ps->em, "invalid time unit in 'bounce every'");
      ps->rc = -1;
      return;
  }

  ps->job->bounce_interval = interval;
}